

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwtran.c
# Opt level: O0

void png_do_write_invert_alpha(png_row_infop row_info,png_bytep row)

{
  uint uVar1;
  png_bytep ppVar2;
  png_bytep ppVar3;
  uint local_74;
  png_uint_32 row_width_3;
  png_uint_32 i_3;
  png_bytep dp_3;
  png_bytep sp_3;
  png_uint_32 row_width_2;
  png_uint_32 i_2;
  png_bytep dp_2;
  png_bytep sp_2;
  png_uint_32 row_width_1;
  png_uint_32 i_1;
  png_bytep dp_1;
  png_bytep sp_1;
  png_uint_32 row_width;
  png_uint_32 i;
  png_bytep dp;
  png_bytep sp;
  png_bytep row_local;
  png_row_infop row_info_local;
  
  if (row_info->color_type == '\x06') {
    if (row_info->bit_depth == '\b') {
      uVar1 = row_info->width;
      dp = row;
      for (sp_1._4_4_ = 0; sp_1._4_4_ < uVar1; sp_1._4_4_ = sp_1._4_4_ + 1) {
        ppVar2 = dp + 3;
        dp = dp + 4;
        *ppVar2 = 0xff - *ppVar2;
      }
    }
    else {
      uVar1 = row_info->width;
      dp_1 = row;
      for (sp_2._4_4_ = 0; sp_2._4_4_ < uVar1; sp_2._4_4_ = sp_2._4_4_ + 1) {
        ppVar2 = dp_1 + 7;
        ppVar3 = dp_1 + 7;
        dp_1[6] = 0xff - dp_1[6];
        dp_1 = dp_1 + 8;
        *ppVar3 = 0xff - *ppVar2;
      }
    }
  }
  else if (row_info->color_type == '\x04') {
    if (row_info->bit_depth == '\b') {
      uVar1 = row_info->width;
      _row_width_2 = row;
      dp_2 = row;
      for (sp_3._4_4_ = 0; sp_3._4_4_ < uVar1; sp_3._4_4_ = sp_3._4_4_ + 1) {
        ppVar2 = dp_2 + 1;
        ppVar3 = _row_width_2 + 1;
        *_row_width_2 = *dp_2;
        dp_2 = dp_2 + 2;
        _row_width_2 = _row_width_2 + 2;
        *ppVar3 = 0xff - *ppVar2;
      }
    }
    else {
      uVar1 = row_info->width;
      dp_3 = row;
      for (local_74 = 0; local_74 < uVar1; local_74 = local_74 + 1) {
        ppVar2 = dp_3 + 3;
        ppVar3 = dp_3 + 3;
        dp_3[2] = 0xff - dp_3[2];
        dp_3 = dp_3 + 4;
        *ppVar3 = 0xff - *ppVar2;
      }
    }
  }
  return;
}

Assistant:

static void
png_do_write_invert_alpha(png_row_infop row_info, png_bytep row)
{
   png_debug(1, "in png_do_write_invert_alpha");

   {
      if (row_info->color_type == PNG_COLOR_TYPE_RGB_ALPHA)
      {
         if (row_info->bit_depth == 8)
         {
            /* This inverts the alpha channel in RGBA */
            png_bytep sp, dp;
            png_uint_32 i;
            png_uint_32 row_width = row_info->width;

            for (i = 0, sp = dp = row; i < row_width; i++)
            {
               /* Does nothing
               *(dp++) = *(sp++);
               *(dp++) = *(sp++);
               *(dp++) = *(sp++);
               */
               sp+=3; dp = sp;
               *dp = (png_byte)(255 - *(sp++));
            }
         }

#ifdef PNG_WRITE_16BIT_SUPPORTED
         else
         {
            /* This inverts the alpha channel in RRGGBBAA */
            png_bytep sp, dp;
            png_uint_32 i;
            png_uint_32 row_width = row_info->width;

            for (i = 0, sp = dp = row; i < row_width; i++)
            {
               /* Does nothing
               *(dp++) = *(sp++);
               *(dp++) = *(sp++);
               *(dp++) = *(sp++);
               *(dp++) = *(sp++);
               *(dp++) = *(sp++);
               *(dp++) = *(sp++);
               */
               sp+=6; dp = sp;
               *(dp++) = (png_byte)(255 - *(sp++));
               *dp     = (png_byte)(255 - *(sp++));
            }
         }
#endif /* WRITE_16BIT */
      }

      else if (row_info->color_type == PNG_COLOR_TYPE_GRAY_ALPHA)
      {
         if (row_info->bit_depth == 8)
         {
            /* This inverts the alpha channel in GA */
            png_bytep sp, dp;
            png_uint_32 i;
            png_uint_32 row_width = row_info->width;

            for (i = 0, sp = dp = row; i < row_width; i++)
            {
               *(dp++) = *(sp++);
               *(dp++) = (png_byte)(255 - *(sp++));
            }
         }

#ifdef PNG_WRITE_16BIT_SUPPORTED
         else
         {
            /* This inverts the alpha channel in GGAA */
            png_bytep sp, dp;
            png_uint_32 i;
            png_uint_32 row_width = row_info->width;

            for (i = 0, sp = dp = row; i < row_width; i++)
            {
               /* Does nothing
               *(dp++) = *(sp++);
               *(dp++) = *(sp++);
               */
               sp+=2; dp = sp;
               *(dp++) = (png_byte)(255 - *(sp++));
               *dp     = (png_byte)(255 - *(sp++));
            }
         }
#endif /* WRITE_16BIT */
      }
   }
}